

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_interface.h
# Opt level: O0

void __thiscall cppnet::Event::~Event(Event *this)

{
  Event *this_local;
  
  ~Event(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Event() {}